

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
          (detail *this,basic_string_view<char> fmt,format_handler<char> *handler)

{
  format_handler<char> *this_00;
  detail *end;
  detail *end_00;
  detail *end_01;
  
  this_00 = (format_handler<char> *)fmt.size_;
  end = (detail *)(fmt.data_ + (long)this);
  end_01 = this;
  while( true ) {
    while( true ) {
      end_00 = end_01;
      if (end_00 == end) {
        format_handler<char>::on_text(this_00,(char *)this,(char *)end);
        return;
      }
      end_01 = end_00 + 1;
      if (*end_00 == (detail)0x7d) break;
      if (*end_00 == (detail)0x7b) {
        format_handler<char>::on_text(this_00,(char *)this,(char *)end_00);
        this = (detail *)
               parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>
                         ((char *)end_00,(char *)end,this_00);
        end_01 = this;
      }
    }
    if ((end_01 == end) || (*end_01 != (detail)0x7d)) break;
    format_handler<char>::on_text(this_00,(char *)this,(char *)end_01);
    this = end_00 + 2;
    end_01 = this;
  }
  report_error("unmatched \'}\' in format string");
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}